

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  ImGuiDir move_dir;
  int in_EDI;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_ffffffffffffffd8;
  ImGuiNavMoveFlags in_stack_ffffffffffffffdc;
  ImGuiDir in_stack_ffffffffffffffe0;
  
  pIVar2 = GImGui;
  ppIVar1 = &GImGui->CurrentWindow;
  GImGui->NavWindow = *ppIVar1;
  move_dir = 3;
  if (((*ppIVar1)->Appearing & 1U) != 0) {
    move_dir = 0x21;
  }
  NavMoveRequestSubmit
            (move_dir,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
  ;
  if (in_EDI == -1) {
    NavMoveRequestResolveWithLastItem
              ((ImGuiNavItemData *)CONCAT44(move_dir,in_stack_ffffffffffffffe0));
  }
  else {
    pIVar2->NavTabbingDir = 1;
    pIVar2->NavTabbingCounter = in_EDI + 1;
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    g.NavWindow = window;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, ImGuiNavMoveFlags_Tabbing | ImGuiNavMoveFlags_FocusApi, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}